

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O1

string * vkt::shaderexecutor::anon_unknown_0::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar1;
  ShaderSpec *shaderSpec_00;
  string *valuePrefix;
  string *psVar2;
  int vecSize;
  DataType DVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  VarType *varType_;
  pointer pSVar5;
  int iVar6;
  VarType intType;
  ostringstream src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ShaderSpec *local_220;
  undefined8 local_218;
  string *local_210;
  string *local_208;
  VarType local_200;
  DeclareVariable local_1e8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_218 = CONCAT71(in_register_00000011,useIntOutputs);
  local_210 = inputPrefix;
  local_208 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  sVar1 = (shaderSpec->globalDeclarations)._M_string_length;
  if (sVar1 != 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(shaderSpec->globalDeclarations)._M_dataplus._M_p,sVar1
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  pSVar5 = (shaderSpec->outputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_220 = shaderSpec;
  if (pSVar5 != (shaderSpec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar6 = 0;
    varType_ = &pSVar5->varType;
    do {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&varType_[-2].m_data + 8);
      DVar3 = (varType_->m_data).basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        vecSize = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < vecSize) {
          DVar3 = glu::getDataTypeIntVec(vecSize);
        }
        glu::VarType::VarType(&local_200,DVar3,PRECISION_HIGHP);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"layout(location = ",0x12);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") flat in ",10);
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       outLocationMap,__rhs);
        glu::decl::DeclareVariable::DeclareVariable(&local_1e8,&local_200,&local_240,0);
        poVar4 = glu::decl::operator<<(poVar4,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
          operator_delete(local_1e8.name._M_dataplus._M_p,
                          local_1e8.name.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_1e8.varType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_200);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"layout(location = ",0x12);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") flat in ",10);
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       outLocationMap,__rhs);
        glu::decl::DeclareVariable::DeclareVariable(&local_1e8,varType_,&local_240,0);
        poVar4 = glu::decl::operator<<(poVar4,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
          operator_delete(local_1e8.name._M_dataplus._M_p,
                          local_1e8.name.field_2._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType(&local_1e8.varType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
      }
      iVar6 = iVar6 + 1;
      pSVar5 = (pointer)(varType_ + 1);
      varType_ = (VarType *)&varType_[2].m_data;
    } while (pSVar5 != (local_220->outputs).
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  valuePrefix = local_210;
  shaderSpec_00 = local_220;
  generateFragShaderOutputDecl
            ((ostream *)local_1a8,local_220,SUB81(local_218,0),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_210,inputPrefix);
  psVar2 = local_208;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n",0x14);
  generateFragShaderOutAssign
            ((ostream *)local_1a8,shaderSpec_00,SUB81(outLocationMap,0),valuePrefix,inputPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	std::ostringstream	src;

	src <<	"#version 310 es\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	int locationNumber = 0;
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output, ++locationNumber)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}